

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *data;
  int iVar1;
  uchar *puVar2;
  stbi__context s;
  stbi__context local_100;
  
  data = local_100.buffer_start;
  local_100.io.eof = stbi__stdio_eof;
  local_100.io.read._0_4_ = 0x10c133;
  local_100.io.read._4_4_ = 0;
  local_100.io.skip._0_4_ = 0x10c149;
  local_100.io.skip._4_4_ = 0;
  local_100.read_from_callbacks = 1;
  local_100.buflen = 0x80;
  local_100.io_user_data = f;
  local_100.img_buffer_original = data;
  iVar1 = stbi__stdio_read(f,(char *)data,0x80);
  if (iVar1 == 0) {
    local_100.img_buffer_end = local_100.buffer_start + 1;
    local_100._48_8_ = local_100._48_8_ & 0xffffffff00000000;
    local_100.buffer_start[0] = '\0';
  }
  else {
    local_100.img_buffer_end = data + iVar1;
  }
  local_100.img_buffer = data;
  puVar2 = stbi__load_flip(&local_100,x,y,comp,req_comp);
  if (puVar2 != (uchar *)0x0) {
    fseek((FILE *)f,(long)((int)local_100.img_buffer - (int)local_100.img_buffer_end),1);
  }
  return puVar2;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_flip(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}